

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O1

void amrex::Multiply<amrex::FArrayBox,void>
               (FabArray<amrex::FArrayBox> *dst,FabArray<amrex::FArrayBox> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  Array4<double> dstFab;
  Array4<const_double> srcFab;
  MFIter mfi;
  Box local_178;
  int local_15c;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  IntVect *local_138;
  FabArray<amrex::FArrayBox> *local_130;
  FabArray<amrex::FArrayBox> *local_128;
  ulong local_120;
  ulong local_118;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  local_130 = dst;
  local_128 = src;
  MFIter::MFIter(&local_90,&dst->super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_120 = (ulong)(uint)numcomp;
    local_140 = (long)srccomp << 3;
    local_148 = (long)dstcomp << 3;
    local_138 = nghost;
    do {
      MFIter::growntilebox(&local_178,&local_90,nghost);
      if ((((local_178.smallend.vect[0] <= local_178.bigend.vect[0]) &&
           (local_178.smallend.vect[1] <= local_178.bigend.vect[1])) &&
          (local_178.smallend.vect[2] <= local_178.bigend.vect[2])) && (local_178.btype.itype < 8))
      {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,local_128,&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,local_130,&local_90);
        nghost = local_138;
        if (0 < numcomp) {
          local_15c = local_178.smallend.vect[2];
          lVar3 = (long)local_178.smallend.vect[1];
          local_150 = local_148;
          local_158 = local_140;
          uVar1 = 0;
          do {
            local_118 = uVar1;
            iVar2 = local_178.smallend.vect[2];
            if (local_178.smallend.vect[2] <= local_178.bigend.vect[2]) {
              do {
                if (local_178.smallend.vect[1] <= local_178.bigend.vect[1]) {
                  lVar6 = (long)local_d0.p +
                          local_d0.nstride * local_158 +
                          (lVar3 - local_d0.begin.y) * local_d0.jstride * 8 +
                          ((long)iVar2 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                          (long)local_d0.begin.x * -8 + (long)local_178.smallend.vect[0] * 8;
                  lVar5 = (long)local_110.p +
                          local_110.nstride * local_150 +
                          (lVar3 - local_110.begin.y) * local_110.jstride * 8 +
                          ((long)iVar2 - (long)local_110.begin.z) * local_110.kstride * 8 +
                          (long)local_110.begin.x * -8 + (long)local_178.smallend.vect[0] * 8;
                  lVar4 = lVar3;
                  do {
                    if (local_178.smallend.vect[0] <= local_178.bigend.vect[0]) {
                      lVar7 = 0;
                      do {
                        *(double *)(lVar5 + lVar7 * 8) =
                             *(double *)(lVar6 + lVar7 * 8) * *(double *)(lVar5 + lVar7 * 8);
                        lVar7 = lVar7 + 1;
                      } while ((local_178.bigend.vect[0] - local_178.smallend.vect[0]) + 1 !=
                               (int)lVar7);
                    }
                    lVar4 = lVar4 + 1;
                    lVar6 = lVar6 + local_d0.jstride * 8;
                    lVar5 = lVar5 + local_110.jstride * 8;
                  } while (local_178.bigend.vect[1] + 1 != (int)lVar4);
                }
                bVar8 = iVar2 != local_178.bigend.vect[2];
                iVar2 = iVar2 + 1;
              } while (bVar8);
            }
            local_158 = local_158 + 8;
            local_150 = local_150 + 8;
            uVar1 = local_118 + 1;
          } while (local_118 + 1 != local_120);
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
Multiply (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstfa = dst.arrays();
        auto const& srcfa = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstfa[box_no](i,j,k,n+dstcomp) *= srcfa[box_no](i,j,k,n+srccomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,n+dstcomp) *= srcFab(i,j,k,n+srccomp);
                });
            }
        }
    }
}